

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

void __thiscall dgPolyhedra::ChangeEdgeIncidentVertex(dgPolyhedra *this,dgEdge *edge,HaI32 newIndex)

{
  dgEdge *pdVar1;
  dgTreeNode *node;
  dgEdge *pdVar2;
  
  pdVar2 = edge;
  while ((pdVar2[-1].m_mark & 2) != 0) {
    dgTree<dgEdge,_long>::ReplaceKey
              (&this->super_dgTree<dgEdge,_long>,(dgTreeNode *)&pdVar2[-1].m_userData,
               (long)pdVar2->m_twin->m_incidentVertex | (long)newIndex << 0x20);
    pdVar1 = pdVar2->m_twin;
    if ((pdVar1[-1].m_mark & 2) == 0) break;
    dgTree<dgEdge,_long>::ReplaceKey
              (&this->super_dgTree<dgEdge,_long>,(dgTreeNode *)&pdVar1[-1].m_userData,
               (ulong)(uint)pdVar1->m_incidentVertex << 0x20 | (long)newIndex);
    pdVar2->m_incidentVertex = newIndex;
    pdVar2 = pdVar2->m_twin->m_next;
    if (pdVar2 == edge) {
      return;
    }
  }
  __assert_fail("retnode->IsInTree ()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTree.h"
                ,0x193,
                "typename dgTree<OBJECT, KEY>::dgTreeNode *dgTree<dgEdge, long>::GetNodeFromInfo(OBJECT &) const [OBJECT = dgEdge, KEY = long]"
               );
}

Assistant:

void dgPolyhedra::ChangeEdgeIncidentVertex (dgEdge* const edge, hacd::HaI32 newIndex)
{
	dgEdge* ptr = edge;
	do {
		dgTreeNode* node = GetNodeFromInfo(*ptr);
		dgPairKey Key0 (newIndex, ptr->m_twin->m_incidentVertex);
		ReplaceKey (node, Key0.GetVal());

		node = GetNodeFromInfo(*ptr->m_twin);
		dgPairKey Key1 (ptr->m_twin->m_incidentVertex, newIndex);
		ReplaceKey (node, Key1.GetVal());

		ptr->m_incidentVertex = newIndex;

		ptr = ptr->m_twin->m_next;
	} while (ptr != edge);
}